

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O3

box_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>,2ul>
::
box_from_bounds<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>>
          (void *__return_storage_ptr__,undefined8 param_2,long *space)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  
  *(undefined8 *)__return_storage_ptr__ = 0x7fefffffffffffff;
  *(undefined8 *)((long)__return_storage_ptr__ + 8) = 0x7fefffffffffffff;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x10) = 0xffefffffffffffff;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x18) = 0xffefffffffffffff;
  lVar3 = space[1];
  if (lVar3 != 0) {
    lVar4 = *space;
    lVar6 = 0;
    do {
      lVar8 = 0;
      bVar5 = true;
      do {
        bVar7 = bVar5;
        dVar2 = *(double *)(lVar6 * 0x10 + lVar4 + lVar8 * 8);
        if (dVar2 < *(double *)((long)__return_storage_ptr__ + lVar8 * 8)) {
          *(double *)((long)__return_storage_ptr__ + lVar8 * 8) = dVar2;
        }
        pdVar1 = (double *)((long)__return_storage_ptr__ + lVar8 * 8 + 0x10);
        if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
          *(double *)((long)__return_storage_ptr__ + lVar8 * 8 + 0x10) = dVar2;
        }
        lVar8 = 1;
        bVar5 = false;
      } while (bVar7);
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar3);
  }
  return (box_type *)__return_storage_ptr__;
}

Assistant:

box_type box_from_bounds(SpaceWrapper_ space, bounds_from_space_t) const {
    return space.compute_bounding_box();
  }